

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O2

void __thiscall glcts::anon_unknown_0::Uniform::~Uniform(Uniform *this)

{
  std::__cxx11::string::~string((string *)&this->shortName);
  std::__cxx11::string::~string((string *)&this->name);
  std::
  vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  ::~vector(&this->childUniforms);
  UniformValue::~UniformValue(&this->value);
  UniformType::~UniformType(&this->type);
  return;
}

Assistant:

Uniform(UniformValueGenerator& generator, UniformType _type, Loc _location,
			DefOccurence _declOccurence = DefOccurence::ALL_SH, DefOccurence _usageOccurence = DefOccurence::ALL_SH)
		: type(_type)
		, location(_location)
		, declOccurence(_declOccurence)
		, usageOccurence(_usageOccurence)
		, value(_type, generator)
	{

		if (type.isStruct())
		{
			int currentLocation = location.val;
			for (int arrayElem = 0; arrayElem < type.arraySize; arrayElem++)
			{
				for (size_t child = 0; child < type.childTypes.size(); child++)
				{
					Loc childLocation = Loc::Implicit();
					if (currentLocation > 0)
					{
						childLocation = Loc::C(currentLocation);
					}
					childUniforms.push_back(
						Uniform(generator, type.childTypes[child], childLocation, declOccurence, usageOccurence));
					currentLocation += type.childTypes[child].arraySize;
				}
			}
		}
	}